

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O0

Span<const_MILBlob::UInt1,_18446744073709551615UL> __thiscall
MILBlob::Blob::StorageReader::Impl::GetDataViewForSubByteSized<MILBlob::UInt1>
          (Impl *this,uint64_t offset)

{
  pointer this_00;
  runtime_error *this_01;
  Span<const_unsigned_char,_18446744073709551615UL> SVar1;
  Span<const_MILBlob::UInt1,_18446744073709551615UL> SVar2;
  size_t numElements;
  size_t numBits;
  Util *pUStack_78;
  Span<const_unsigned_char,_18446744073709551615UL> rawSpan;
  blob_metadata metadata;
  uint64_t offset_local;
  Impl *this_local;
  
  GetAndCheckMetadata((blob_metadata *)&rawSpan.m_size,this,offset,UInt1);
  this_00 = std::
            unique_ptr<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
            ::operator->(&this->m_reader);
  SVar1 = MMapFileReader::ReadData(this_00,metadata.sizeInBytes,metadata._0_8_);
  if (metadata.offset < 8) {
    pUStack_78 = (Util *)SVar1.m_ptr;
    rawSpan.m_ptr = (pointer)SVar1.m_size.m_size;
    SVar1.m_size.m_size = metadata._0_8_ * 8 - metadata.offset;
    SVar1.m_ptr = rawSpan.m_ptr;
    SVar2 = Util::CastToBitSpan<const_MILBlob::UInt1,_const_unsigned_char,_true>
                      (pUStack_78,SVar1,metadata.offset);
    return SVar2;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,"8 or more bits of padding for sub-byte sized data is incorrect");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Util::Span<const T> GetDataViewForSubByteSized(uint64_t offset) const
    {
        auto metadata = GetAndCheckMetadata(offset, BlobDataTypeTraits<T>::DataType);

        Util::Span<const uint8_t> rawSpan = m_reader->ReadData(metadata.offset, metadata.sizeInBytes);

        MILVerifyIsTrue(metadata.padding_size_in_bits < 8,
                        std::runtime_error,
                        "8 or more bits of padding for sub-byte sized data is incorrect");

        if constexpr (MILBlob::SubByteIsByteAligned<T>()) {
            MILVerifyIsTrue(metadata.padding_size_in_bits % T::SizeInBits == 0,
                            std::runtime_error,
                            "Invalid padding for byte-aligned sub-byte-sized type");
        }

        // metadata.sizeInBytes includes the padding to make the data byte aligned

        size_t numBits = metadata.sizeInBytes * 8;
        numBits -= metadata.padding_size_in_bits;
        MILVerifyIsTrue(numBits % T::SizeInBits == 0, std::runtime_error, "Invalid padding for blob");
        size_t numElements = numBits / T::SizeInBits;

        return Util::CastToBitSpan<const T>(rawSpan, numElements);
    }